

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

Pipe __thiscall perfetto::base::Pipe::Create(Pipe *this,Flags flags)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  int cur_flags_1;
  int cur_flags;
  int local_1c;
  int local_18;
  PlatformHandle fds [2];
  Flags flags_local;
  Pipe *p;
  
  fds[0] = flags;
  unique0x10000577 = this;
  iVar2 = pipe(&local_1c);
  if (iVar2 != 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    LogMessage(kLogError,pcVar4,0x1642,"%s (errno: %d, %s)","PERFETTO_CHECK(pipe(fds) == 0)",
               (ulong)uVar3,pcVar7);
    MaybeSerializeLastLogsForCrashReporting();
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  iVar2 = fcntl(local_1c,2,1);
  if (iVar2 != 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    LogMessage(kLogError,pcVar4,0x1643,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(fcntl(fds[0], F_SETFD, FD_CLOEXEC) == 0)",(ulong)uVar3,pcVar7);
    MaybeSerializeLastLogsForCrashReporting();
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  iVar2 = fcntl(local_18,2,1);
  if (iVar2 != 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    LogMessage(kLogError,pcVar4,0x1644,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(fcntl(fds[1], F_SETFD, FD_CLOEXEC) == 0)",(ulong)uVar3,pcVar7);
    MaybeSerializeLastLogsForCrashReporting();
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Pipe(this);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&this->rd,local_1c);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&this->wr,local_18);
  if ((fds[0] == 1) || (fds[0] == 2)) {
    iVar2 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
            ::operator*(&this->rd);
    uVar3 = fcntl(iVar2,3,0);
    if ((int)uVar3 < 0) {
      pcVar4 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar5 = (uint *)__errno_location();
      uVar3 = *puVar5;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      LogMessage(kLogError,pcVar4,0x164d,"%s (errno: %d, %s)","PERFETTO_CHECK(cur_flags >= 0)",
                 (ulong)uVar3,pcVar7);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar2 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
            ::operator*(&this->rd);
    iVar2 = fcntl(iVar2,4,(ulong)(uVar3 | 0x800));
    if (iVar2 != 0) {
      pcVar4 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar5 = (uint *)__errno_location();
      uVar3 = *puVar5;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      LogMessage(kLogError,pcVar4,0x164e,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(fcntl(*p.rd, F_SETFL, cur_flags | O_NONBLOCK) == 0)",(ulong)uVar3,
                 pcVar7);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if ((fds[0] == 1) || (fds[0] == 3)) {
    iVar2 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
            ::operator*(&this->wr);
    uVar3 = fcntl(iVar2,3,0);
    if ((int)uVar3 < 0) {
      pcVar4 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar5 = (uint *)__errno_location();
      uVar3 = *puVar5;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      LogMessage(kLogError,pcVar4,0x1653,"%s (errno: %d, %s)","PERFETTO_CHECK(cur_flags >= 0)",
                 (ulong)uVar3,pcVar7);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar2 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
            ::operator*(&this->wr);
    iVar2 = fcntl(iVar2,4,(ulong)(uVar3 | 0x800));
    if (iVar2 != 0) {
      pcVar4 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar5 = (uint *)__errno_location();
      uVar3 = *puVar5;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      LogMessage(kLogError,pcVar4,0x1654,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(fcntl(*p.wr, F_SETFL, cur_flags | O_NONBLOCK) == 0)",(ulong)uVar3,
                 pcVar7);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return (Pipe)this;
}

Assistant:

Pipe Pipe::Create(Flags flags) {
  PlatformHandle fds[2];
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  PERFETTO_CHECK(::CreatePipe(&fds[0], &fds[1], /*lpPipeAttributes=*/nullptr,
                              0 /*default size*/));
#else
  PERFETTO_CHECK(pipe(fds) == 0);
  PERFETTO_CHECK(fcntl(fds[0], F_SETFD, FD_CLOEXEC) == 0);
  PERFETTO_CHECK(fcntl(fds[1], F_SETFD, FD_CLOEXEC) == 0);
#endif
  Pipe p;
  p.rd.reset(fds[0]);
  p.wr.reset(fds[1]);

#if !PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  if (flags == kBothNonBlock || flags == kRdNonBlock) {
    int cur_flags = fcntl(*p.rd, F_GETFL, 0);
    PERFETTO_CHECK(cur_flags >= 0);
    PERFETTO_CHECK(fcntl(*p.rd, F_SETFL, cur_flags | O_NONBLOCK) == 0);
  }

  if (flags == kBothNonBlock || flags == kWrNonBlock) {
    int cur_flags = fcntl(*p.wr, F_GETFL, 0);
    PERFETTO_CHECK(cur_flags >= 0);
    PERFETTO_CHECK(fcntl(*p.wr, F_SETFL, cur_flags | O_NONBLOCK) == 0);
  }
#else
  PERFETTO_CHECK(flags == kBothBlock);
#endif
  return p;
}